

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams>::
~DrawTestInstance(DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this)

{
  ~DrawTestInstance(this);
  operator_delete(this,0x1c0);
  return;
}

Assistant:

DrawTestInstance<T>::~DrawTestInstance (void)
{
}